

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::SingleVertexArrayUsageTests::init
          (SingleVertexArrayUsageTests *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  Usage usage_;
  GLValue max_;
  TestNode *this_00;
  int iVar1;
  int iVar2;
  MultiVertexArrayTest *this_01;
  long lVar3;
  long lVar4;
  bool bVar5;
  GLValue GVar6;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  long local_f8;
  undefined1 local_f0 [16];
  pointer local_e0;
  pointer pAStack_d8;
  pointer local_d0;
  TestNode *local_c8;
  long local_c0;
  long local_b8;
  string local_b0;
  InputType local_90;
  undefined4 uStack_8c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_88;
  InputType local_80;
  undefined4 uStack_7c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_78;
  ArraySpec local_70;
  
  lVar3 = 0;
  local_c8 = (TestNode *)this;
  do {
    local_f8 = 0;
    local_c0 = lVar3;
    do {
      local_b8 = 0;
      do {
        lVar4 = 0;
        do {
          if (local_b8 == 1) {
            iVar1 = deqp::gls::Array::inputTypeSize((&DAT_01c0f670)[lVar3]);
            iVar1 = iVar1 * 2;
          }
          else {
            iVar1 = (&DAT_01c0f6a0)[local_b8];
          }
          type = (&DAT_01c0f670)[lVar3];
          iVar2 = deqp::gls::Array::inputTypeSize(type);
          usage_ = *(Usage *)((long)&DAT_01bf57cc + lVar4);
          GVar6 = deqp::gls::GLValue::getMinValue(type);
          aStack_78 = GVar6.field_1;
          local_80 = GVar6.type;
          GVar6 = deqp::gls::GLValue::getMaxValue(type);
          aStack_88 = GVar6.field_1;
          local_90 = GVar6.type;
          max_._4_4_ = uStack_8c;
          max_.type = local_90;
          GVar6._4_4_ = uStack_7c;
          GVar6.type = local_80;
          GVar6.field_1 = aStack_78;
          max_.field_1 = aStack_88;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    (&local_70,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,usage_,2,0,iVar1,false,GVar6,max_
                    );
          local_e0 = (pointer)0x0;
          pAStack_d8 = (pointer)0x0;
          local_d0 = (pointer)0x0;
          local_f0._0_4_ = PRIMITIVE_TRIANGLES;
          local_f0._4_4_ = (&DAT_01c0f870)[local_f8];
          local_f0._8_4_ = 0;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
          ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                    ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                      *)&local_e0,(iterator)0x0,&local_70);
          deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_(&local_b0,(Spec *)local_f0);
          lVar3 = local_c0;
          this_00 = local_c8;
          if (iVar1 % iVar2 == 0) {
            this_01 = (MultiVertexArrayTest *)operator_new(0xe0);
            deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                      (this_01,this_00->m_testCtx,(RenderContext *)this_00[1]._vptr_TestNode[1],
                       (Spec *)local_f0,local_b0._M_dataplus._M_p,local_b0._M_dataplus._M_p);
            tcu::TestNode::addChild(this_00,(TestNode *)this_01);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if (local_e0 != (pointer)0x0) {
            operator_delete(local_e0,(long)local_d0 - (long)local_e0);
          }
          lVar4 = lVar4 + 4;
        } while (lVar4 != 0xc);
        local_b8 = local_b8 + 1;
      } while (local_b8 != 4);
      lVar4 = local_f8 + 1;
      bVar5 = local_f8 == 0;
      local_f8 = lVar4;
    } while (bVar5);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return (int)lVar4;
}

Assistant:

void SingleVertexArrayUsageTests::init (void)
{
	// Test usage
	Array::Usage		usages[]		= {Array::USAGE_STATIC_DRAW, Array::USAGE_STREAM_DRAW, Array::USAGE_DYNAMIC_DRAW};
	int					counts[]		= {1, 256};
	int					strides[]		= {0, -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_FIXED, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usages); usageNdx++)
				{
					const int	componentCount	= 2;
					const int	stride			= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * componentCount : strides[strideNdx]);
					const bool	aligned			= (stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0;
					MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																	Array::OUTPUTTYPE_VEC2,
																	Array::STORAGE_BUFFER,
																	usages[usageNdx],
																	componentCount,
																	0,
																	stride,
																	false,
																	GLValue::getMinValue(inputTypes[inputTypeNdx]),
																	GLValue::getMaxValue(inputTypes[inputTypeNdx]));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					std::string name = spec.getName();

					if (aligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}